

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Document::parseYAMLDirective(Document *this)

{
  undefined1 local_40 [56];
  
  getNext((Token *)local_40,this);
  std::__cxx11::string::~string((string *)(local_40 + 0x18));
  return;
}

Assistant:

void Document::parseYAMLDirective() {
  getNext(); // Eat %YAML <version>
}